

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
::vector(vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
         *this,vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
               *other)

{
  vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
  *other_local;
  vector<pbrt::RGBIlluminantSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBIlluminantSpectrum>_>
  *this_local;
  
  (this->alloc).memoryResource = (other->alloc).memoryResource;
  this->ptr = (RGBIlluminantSpectrum *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  this->nStored = other->nStored;
  this->nAlloc = other->nAlloc;
  this->ptr = other->ptr;
  other->nAlloc = 0;
  other->nStored = 0;
  other->ptr = (RGBIlluminantSpectrum *)0x0;
  return;
}

Assistant:

vector(vector &&other) : alloc(other.alloc) {
        nStored = other.nStored;
        nAlloc = other.nAlloc;
        ptr = other.ptr;

        other.nStored = other.nAlloc = 0;
        other.ptr = nullptr;
    }